

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_2_6_True(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  float *data;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  int k_count;
  int iVar35;
  long lVar36;
  int iVar37;
  float *pfVar38;
  int iVar39;
  int iVar40;
  uint uVar41;
  int iVar42;
  float *pfVar43;
  long lVar44;
  long lVar45;
  int iVar46;
  ulong uVar47;
  int iVar48;
  long lVar49;
  int scale;
  long lVar50;
  int iVar51;
  int iVar52;
  float *pfVar53;
  byte bVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  undefined1 auVar89 [12];
  undefined1 auVar88 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  undefined1 auVar93 [64];
  int data_width;
  float local_d8;
  
  auVar63._8_4_ = 0x3effffff;
  auVar63._0_8_ = 0x3effffff3effffff;
  auVar63._12_4_ = 0x3effffff;
  auVar88 = ZEXT1664(auVar63);
  auVar62._8_4_ = 0x80000000;
  auVar62._0_8_ = 0x8000000080000000;
  auVar62._12_4_ = 0x80000000;
  fVar69 = ipoint->scale;
  auVar93 = ZEXT464((uint)fVar69);
  auVar55 = vpternlogd_avx512vl(auVar63,ZEXT416((uint)fVar69),auVar62,0xf8);
  auVar55 = ZEXT416((uint)(fVar69 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  fVar67 = -0.08 / (fVar69 * fVar69);
  scale = (int)auVar55._0_4_;
  auVar56._0_4_ = (int)auVar55._0_4_;
  auVar56._4_4_ = (int)auVar55._4_4_;
  auVar56._8_4_ = (int)auVar55._8_4_;
  auVar56._12_4_ = (int)auVar55._12_4_;
  auVar55 = vcvtdq2ps_avx(auVar56);
  auVar56 = vpternlogd_avx512vl(auVar63,ZEXT416((uint)ipoint->x),auVar62,0xf8);
  auVar56 = ZEXT416((uint)(ipoint->x + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57._0_8_ = (double)auVar56._0_4_;
  auVar57._8_8_ = auVar56._8_8_;
  auVar61._0_8_ = (double)fVar69;
  auVar61._8_8_ = 0;
  auVar56 = vfmadd231sd_fma(auVar57,auVar61,ZEXT816(0x3fe0000000000000));
  auVar60._0_4_ = (float)auVar56._0_8_;
  auVar60._4_12_ = auVar56._4_12_;
  auVar56 = vpternlogd_avx512vl(auVar63,ZEXT416((uint)ipoint->y),auVar62,0xf8);
  fVar5 = auVar60._0_4_ - auVar55._0_4_;
  auVar56 = ZEXT416((uint)(ipoint->y + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar58._0_8_ = (double)auVar56._0_4_;
  auVar58._8_8_ = auVar56._8_8_;
  auVar56 = vfmadd231sd_fma(auVar58,auVar61,ZEXT816(0x3fe0000000000000));
  auVar59._0_4_ = (float)auVar56._0_8_;
  auVar59._4_12_ = auVar56._4_12_;
  fVar92 = auVar59._0_4_ - auVar55._0_4_;
  auVar55 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar69),auVar60);
  auVar56 = vpternlogd_avx512vl(auVar63,auVar55,auVar62,0xf8);
  auVar55 = ZEXT416((uint)(auVar55._0_4_ + auVar56._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = ZEXT416((uint)fVar69);
  if (scale < (int)auVar55._0_4_) {
    auVar64._8_4_ = 0x3effffff;
    auVar64._0_8_ = 0x3effffff3effffff;
    auVar64._12_4_ = 0x3effffff;
    auVar65._8_4_ = 0x80000000;
    auVar65._0_8_ = 0x8000000080000000;
    auVar65._12_4_ = 0x80000000;
    auVar55 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar56,auVar59);
    auVar57 = vpternlogd_avx512vl(auVar65,auVar55,auVar64,0xea);
    auVar55 = ZEXT416((uint)(auVar55._0_4_ + auVar57._0_4_));
    auVar55 = vroundss_avx(auVar55,auVar55,0xb);
    if (scale < (int)auVar55._0_4_) {
      auVar55 = vfmadd231ss_fma(auVar60,auVar56,ZEXT416(0x41300000));
      auVar66._8_4_ = 0x80000000;
      auVar66._0_8_ = 0x8000000080000000;
      auVar66._12_4_ = 0x80000000;
      auVar57 = vpternlogd_avx512vl(auVar66,auVar55,auVar64,0xea);
      auVar55 = ZEXT416((uint)(auVar55._0_4_ + auVar57._0_4_));
      auVar55 = vroundss_avx(auVar55,auVar55,0xb);
      if ((int)auVar55._0_4_ + scale <= iimage->width) {
        auVar55 = vfmadd231ss_fma(auVar59,auVar56,ZEXT416(0x41300000));
        auVar15._8_4_ = 0x80000000;
        auVar15._0_8_ = 0x8000000080000000;
        auVar15._12_4_ = 0x80000000;
        auVar57 = vpternlogd_avx512vl(auVar64,auVar55,auVar15,0xf8);
        auVar55 = ZEXT416((uint)(auVar55._0_4_ + auVar57._0_4_));
        auVar55 = vroundss_avx(auVar55,auVar55,0xb);
        if ((int)auVar55._0_4_ + scale <= iimage->height) {
          iVar2 = iimage->data_width;
          pfVar43 = iimage->data;
          fVar5 = fVar5 + 0.5;
          iVar51 = scale * 2;
          pfVar38 = haarResponseY + 0x1d;
          pfVar53 = haarResponseX + 0x1d;
          uVar24 = 0xfffffff4;
          do {
            auVar55._0_4_ = (float)(int)uVar24;
            auVar55._4_12_ = in_ZMM8._4_12_;
            lVar33 = 0;
            auVar84._0_4_ = (float)(int)(uVar24 | 1);
            auVar84._4_12_ = in_ZMM8._4_12_;
            auVar55 = vfmadd213ss_fma(auVar55,auVar56,ZEXT416((uint)(fVar92 + 0.5)));
            auVar57 = vfmadd213ss_fma(auVar84,auVar56,ZEXT416((uint)(fVar92 + 0.5)));
            iVar20 = (int)auVar55._0_4_;
            iVar23 = (int)auVar57._0_4_;
            iVar21 = (iVar20 + -1) * iVar2;
            iVar19 = (iVar20 + -1 + scale) * iVar2;
            iVar22 = (iVar20 + -1 + iVar51) * iVar2;
            iVar27 = (iVar23 + -1) * iVar2;
            iVar20 = (iVar23 + -1 + scale) * iVar2;
            iVar23 = (iVar23 + -1 + iVar51) * iVar2;
            do {
              iVar28 = (int)lVar33;
              auVar79._0_4_ = (float)(iVar28 + -0xc);
              auVar89 = auVar88._4_12_;
              auVar79._4_12_ = auVar89;
              auVar86._0_4_ = (float)(iVar28 + -9);
              auVar86._4_12_ = auVar89;
              auVar85._0_4_ = (float)(iVar28 + -8);
              auVar85._4_12_ = auVar89;
              auVar55 = vfmadd213ss_fma(auVar79,auVar56,ZEXT416((uint)fVar5));
              auVar57 = vfmadd213ss_fma(auVar86,auVar56,ZEXT416((uint)fVar5));
              auVar59 = ZEXT416((uint)fVar5);
              auVar58 = vfmadd213ss_fma(auVar85,auVar56,auVar59);
              iVar35 = (int)auVar55._0_4_;
              auVar80._0_4_ = (float)(iVar28 + -0xb);
              auVar80._4_12_ = auVar89;
              auVar55 = vfmadd213ss_fma(auVar80,auVar56,auVar59);
              iVar39 = (int)auVar55._0_4_;
              auVar81._0_4_ = (float)(iVar28 + -10);
              auVar81._4_12_ = auVar89;
              auVar55 = vfmadd213ss_fma(auVar81,auVar56,auVar59);
              iVar29 = (int)auVar55._0_4_;
              auVar82._0_4_ = (float)(iVar28 + -7);
              auVar82._4_12_ = auVar89;
              auVar55 = vfmadd213ss_fma(auVar82,auVar56,auVar59);
              iVar40 = iVar35 + -1 + scale;
              iVar30 = iVar35 + -1 + iVar51;
              fVar69 = pfVar43[iVar22 + -1 + iVar35];
              fVar68 = pfVar43[iVar21 + iVar30];
              auVar61 = SUB6416(ZEXT464(0x40000000),0);
              auVar59 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar21 + iVar40] -
                                                      pfVar43[iVar22 + iVar40])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar22 + iVar30] -
                                                      pfVar43[iVar21 + -1 + iVar35])));
              auVar60 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar19 + -1 + iVar35] -
                                                      pfVar43[iVar19 + iVar30])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar22 + iVar30] -
                                                      pfVar43[iVar21 + -1 + iVar35])));
              pfVar53[lVar33 + -0x1d] = (fVar69 - fVar68) + auVar59._0_4_;
              pfVar38[lVar33 + -0x1d] = auVar60._0_4_ - (fVar69 - fVar68);
              iVar37 = (int)auVar57._0_4_;
              fVar69 = pfVar43[iVar23 + -1 + iVar35];
              fVar68 = pfVar43[iVar27 + iVar30];
              iVar42 = iVar39 + -1 + scale;
              auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar27 + iVar40] -
                                                      pfVar43[iVar40 + iVar23])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar30 + iVar23] -
                                                      pfVar43[iVar27 + -1 + iVar35])));
              auVar59 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar20 + -1 + iVar35] -
                                                      pfVar43[iVar20 + iVar30])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar30 + iVar23] -
                                                      pfVar43[iVar27 + -1 + iVar35])));
              pfVar53[lVar33 + -5] = (fVar69 - fVar68) + auVar57._0_4_;
              pfVar38[lVar33 + -5] = auVar59._0_4_ - (fVar69 - fVar68);
              iVar30 = iVar39 + -1 + iVar51;
              fVar69 = pfVar43[iVar22 + -1 + iVar39];
              fVar68 = pfVar43[iVar21 + iVar30];
              auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar19 + -1 + iVar39] -
                                                      pfVar43[iVar19 + iVar30])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar22 + iVar30] -
                                                      pfVar43[iVar21 + -1 + iVar39])));
              auVar59 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar21 + iVar42] -
                                                      pfVar43[iVar22 + iVar42])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar22 + iVar30] -
                                                      pfVar43[iVar21 + -1 + iVar39])));
              pfVar53[lVar33 + -0x1c] = (fVar69 - fVar68) + auVar59._0_4_;
              pfVar38[lVar33 + -0x1c] = auVar57._0_4_ - (fVar69 - fVar68);
              fVar69 = pfVar43[iVar23 + -1 + iVar39];
              fVar68 = pfVar43[iVar27 + iVar30];
              iVar40 = iVar29 + -1 + iVar51;
              iVar35 = iVar29 + -1 + scale;
              auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar27 + iVar42] -
                                                      pfVar43[iVar42 + iVar23])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar30 + iVar23] -
                                                      pfVar43[iVar27 + -1 + iVar39])));
              auVar59 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar20 + -1 + iVar39] -
                                                      pfVar43[iVar20 + iVar30])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar30 + iVar23] -
                                                      pfVar43[iVar27 + -1 + iVar39])));
              pfVar53[lVar33 + -4] = (fVar69 - fVar68) + auVar57._0_4_;
              pfVar38[lVar33 + -4] = auVar59._0_4_ - (fVar69 - fVar68);
              fVar69 = pfVar43[iVar22 + -1 + iVar29];
              fVar68 = pfVar43[iVar21 + iVar40];
              auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar21 + iVar35] -
                                                      pfVar43[iVar22 + iVar35])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar22 + iVar40] -
                                                      pfVar43[iVar21 + -1 + iVar29])));
              auVar59 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar19 + -1 + iVar29] -
                                                      pfVar43[iVar19 + iVar40])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar22 + iVar40] -
                                                      pfVar43[iVar21 + -1 + iVar29])));
              pfVar53[lVar33 + -0x1b] = (fVar69 - fVar68) + auVar57._0_4_;
              pfVar38[lVar33 + -0x1b] = auVar59._0_4_ - (fVar69 - fVar68);
              iVar30 = (int)auVar58._0_4_;
              fVar69 = pfVar43[iVar23 + -1 + iVar29];
              fVar68 = pfVar43[iVar27 + iVar40];
              in_ZMM8 = ZEXT464((uint)pfVar43[iVar40 + iVar23]);
              iVar42 = iVar37 + -1 + scale;
              auVar58 = ZEXT416((uint)(pfVar43[iVar40 + iVar23] - pfVar43[iVar27 + -1 + iVar29]));
              auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar27 + iVar35] -
                                                      pfVar43[iVar35 + iVar23])),auVar61,auVar58);
              auVar58 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar20 + -1 + iVar29] -
                                                      pfVar43[iVar20 + iVar40])),auVar61,auVar58);
              pfVar53[lVar33 + -3] = (fVar69 - fVar68) + auVar57._0_4_;
              pfVar38[lVar33 + -3] = auVar58._0_4_ - (fVar69 - fVar68);
              iVar39 = iVar37 + -1 + iVar51;
              fVar69 = pfVar43[iVar22 + -1 + iVar37];
              fVar68 = pfVar43[iVar21 + iVar39];
              auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar19 + -1 + iVar37] -
                                                      pfVar43[iVar19 + iVar39])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar22 + iVar39] -
                                                      pfVar43[iVar21 + -1 + iVar37])));
              auVar58 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar21 + iVar42] -
                                                      pfVar43[iVar22 + iVar42])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar22 + iVar39] -
                                                      pfVar43[iVar21 + -1 + iVar37])));
              pfVar53[lVar33 + -0x1a] = (fVar69 - fVar68) + auVar58._0_4_;
              pfVar38[lVar33 + -0x1a] = auVar57._0_4_ - (fVar69 - fVar68);
              iVar40 = (int)auVar55._0_4_;
              iVar35 = iVar30 + -1 + iVar51;
              fVar69 = pfVar43[iVar23 + -1 + iVar37];
              auVar88 = ZEXT464((uint)pfVar43[iVar39 + iVar23]);
              fVar68 = pfVar43[iVar27 + iVar39];
              iVar29 = iVar30 + -1 + scale;
              auVar57 = ZEXT416((uint)(pfVar43[iVar39 + iVar23] - pfVar43[iVar27 + -1 + iVar37]));
              auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar27 + iVar42] -
                                                      pfVar43[iVar42 + iVar23])),auVar61,auVar57);
              auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar20 + -1 + iVar37] -
                                                      pfVar43[iVar20 + iVar39])),auVar61,auVar57);
              pfVar53[lVar33 + -2] = (fVar69 - fVar68) + auVar55._0_4_;
              pfVar38[lVar33 + -2] = auVar57._0_4_ - (fVar69 - fVar68);
              fVar69 = pfVar43[iVar22 + -1 + iVar30];
              fVar68 = pfVar43[iVar21 + iVar35];
              auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar21 + iVar29] -
                                                      pfVar43[iVar22 + iVar29])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar22 + iVar35] -
                                                      pfVar43[iVar21 + -1 + iVar30])));
              auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar19 + -1 + iVar30] -
                                                      pfVar43[iVar19 + iVar35])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar22 + iVar35] -
                                                      pfVar43[iVar21 + -1 + iVar30])));
              pfVar53[lVar33 + -0x19] = (fVar69 - fVar68) + auVar55._0_4_;
              pfVar38[lVar33 + -0x19] = auVar57._0_4_ - (fVar69 - fVar68);
              fVar69 = pfVar43[iVar23 + -1 + iVar30];
              fVar68 = pfVar43[iVar27 + iVar35];
              iVar37 = iVar40 + -1 + scale;
              iVar42 = iVar40 + -1 + iVar51;
              auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar27 + iVar29] -
                                                      pfVar43[iVar29 + iVar23])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar35 + iVar23] -
                                                      pfVar43[iVar27 + -1 + iVar30])));
              auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar20 + -1 + iVar30] -
                                                      pfVar43[iVar20 + iVar35])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar35 + iVar23] -
                                                      pfVar43[iVar27 + -1 + iVar30])));
              pfVar53[lVar33 + -1] = (fVar69 - fVar68) + auVar55._0_4_;
              pfVar38[lVar33 + -1] = auVar57._0_4_ - (fVar69 - fVar68);
              fVar69 = pfVar43[iVar22 + -1 + iVar40];
              fVar68 = pfVar43[iVar21 + iVar42];
              auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar21 + iVar37] -
                                                      pfVar43[iVar22 + iVar37])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar22 + iVar42] -
                                                      pfVar43[iVar21 + -1 + iVar40])));
              auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar19 + -1 + iVar40] -
                                                      pfVar43[iVar19 + iVar42])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar22 + iVar42] -
                                                      pfVar43[iVar21 + -1 + iVar40])));
              pfVar53[lVar33 + -0x18] = (fVar69 - fVar68) + auVar55._0_4_;
              pfVar38[lVar33 + -0x18] = auVar57._0_4_ - (fVar69 - fVar68);
              fVar69 = pfVar43[iVar23 + -1 + iVar40];
              fVar68 = pfVar43[iVar27 + iVar42];
              auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar27 + iVar37] -
                                                      pfVar43[iVar37 + iVar23])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar42 + iVar23] -
                                                      pfVar43[iVar27 + -1 + iVar40])));
              auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar20 + -1 + iVar40] -
                                                      pfVar43[iVar20 + iVar42])),auVar61,
                                        ZEXT416((uint)(pfVar43[iVar42 + iVar23] -
                                                      pfVar43[iVar27 + -1 + iVar40])));
              pfVar53[lVar33] = (fVar69 - fVar68) + auVar55._0_4_;
              pfVar38[lVar33] = auVar57._0_4_ - (fVar69 - fVar68);
              lVar33 = lVar33 + 6;
            } while (iVar28 + -0xc < 6);
            pfVar38 = pfVar38 + 0x30;
            pfVar53 = pfVar53 + 0x30;
            bVar4 = (int)uVar24 < 10;
            uVar24 = uVar24 + 2;
          } while (bVar4);
          goto LAB_001b9c77;
        }
      }
    }
  }
  iVar2 = scale * 2;
  lVar33 = 0;
  uVar24 = 0xfffffff4;
  do {
    auVar70._0_4_ = (float)(int)uVar24;
    auVar70._4_12_ = in_ZMM8._4_12_;
    auVar73._0_4_ = (float)(int)(uVar24 | 1);
    auVar73._4_12_ = in_ZMM8._4_12_;
    auVar55 = vfmadd213ss_fma(auVar70,auVar93._0_16_,ZEXT416((uint)fVar92));
    auVar57 = vfmadd213ss_fma(auVar73,auVar93._0_16_,ZEXT416((uint)fVar92));
    fVar68 = auVar55._0_4_;
    fVar72 = auVar57._0_4_;
    iVar21 = (int)((double)((ulong)(0.0 <= fVar68) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar68) * -0x4020000000000000) + (double)fVar68);
    iVar27 = iVar2 + iVar21;
    iVar28 = iVar21 + -1;
    iVar29 = iVar21 + -1 + scale;
    iVar22 = iVar2 + -1 + iVar21;
    iVar19 = (int)((double)((ulong)(0.0 <= fVar72) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar72) * -0x4020000000000000) + (double)fVar72);
    iVar23 = iVar2 + iVar19;
    iVar37 = iVar19 + -1;
    iVar30 = iVar19 + -1 + scale;
    iVar20 = iVar2 + -1 + iVar19;
    pfVar43 = haarResponseX;
    pfVar53 = haarResponseY;
    lVar32 = lVar33;
    iVar51 = -0xc;
    do {
      auVar71._0_4_ = (float)iVar51;
      auVar71._4_12_ = in_ZMM8._4_12_;
      auVar55 = vfmadd213ss_fma(auVar71,auVar93._0_16_,ZEXT416((uint)fVar5));
      auVar76._0_4_ = (float)(iVar51 + 1);
      auVar76._4_12_ = in_ZMM8._4_12_;
      auVar57 = vfmadd213ss_fma(auVar76,auVar93._0_16_,ZEXT416((uint)fVar5));
      fVar68 = auVar55._0_4_;
      fVar72 = auVar57._0_4_;
      iVar35 = (int)((double)((ulong)(0.0 <= fVar68) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar68) * -0x4020000000000000) + (double)fVar68);
      if (((iVar21 < 1) || (iVar35 < 1)) || (iimage->height < iVar27)) {
LAB_001b8dbe:
        haarXY(iimage,iVar21,iVar35,scale,(float *)((long)pfVar43 + lVar32),
               (float *)((long)pfVar53 + lVar32));
        iVar42 = iimage->width;
        pfVar43 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar42 = iimage->width;
        iVar39 = iVar2 + iVar35;
        if (iVar42 < iVar39) goto LAB_001b8dbe;
        iVar40 = iimage->data_width;
        pfVar38 = iimage->data;
        iVar52 = iVar35 + -1 + scale;
        iVar48 = iVar40 * iVar28;
        iVar46 = iVar40 * iVar22;
        fVar68 = pfVar38[iVar46 + -1 + iVar35];
        fVar6 = pfVar38[iVar48 + -1 + iVar39];
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar48 + iVar52] - pfVar38[iVar46 + iVar52]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar38[iVar46 + -1 + iVar39] -
                                                pfVar38[iVar48 + -1 + iVar35])));
        auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar40 * iVar29 + -1 + iVar35] -
                                                pfVar38[iVar40 * iVar29 + -1 + iVar39])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar38[iVar46 + -1 + iVar39] -
                                                pfVar38[iVar48 + -1 + iVar35])));
        *(float *)((long)pfVar43 + lVar32) = (fVar68 - fVar6) + auVar55._0_4_;
        *(float *)((long)pfVar53 + lVar32) = auVar57._0_4_ - (fVar68 - fVar6);
      }
      pfVar38 = (float *)((long)pfVar43 + lVar32 + 0x60);
      pfVar1 = (float *)((long)pfVar53 + lVar32 + 0x60);
      if (((iVar19 < 1) || (iVar35 < 1)) ||
         ((iimage->height < iVar23 || (iVar39 = iVar2 + iVar35, iVar42 < iVar39)))) {
        haarXY(iimage,iVar19,iVar35,scale,pfVar38,pfVar1);
        iVar42 = iimage->width;
        pfVar43 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar40 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar46 = iVar35 + -1 + scale;
        iVar52 = iVar40 * iVar37;
        iVar48 = iVar40 * iVar20;
        fVar68 = pfVar3[iVar48 + -1 + iVar35];
        fVar6 = pfVar3[iVar52 + -1 + iVar39];
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar52 + iVar46] - pfVar3[iVar48 + iVar46]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar48 + -1 + iVar39] -
                                                pfVar3[iVar52 + -1 + iVar35])));
        auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 * iVar30 + -1 + iVar35] -
                                                pfVar3[iVar40 * iVar30 + -1 + iVar39])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar48 + -1 + iVar39] -
                                                pfVar3[iVar52 + -1 + iVar35])));
        *pfVar38 = (fVar68 - fVar6) + auVar55._0_4_;
        *pfVar1 = auVar57._0_4_ - (fVar68 - fVar6);
      }
      pfVar38 = (float *)((long)pfVar43 + lVar32 + 4);
      pfVar1 = (float *)((long)pfVar53 + lVar32 + 4);
      iVar35 = (int)((double)((ulong)(0.0 <= fVar72) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar72) * -0x4020000000000000) + (double)fVar72);
      if (((iVar21 < 1) || (iVar35 < 1)) ||
         ((iimage->height < iVar27 || (iVar39 = iVar2 + iVar35, iVar42 < iVar39)))) {
        haarXY(iimage,iVar21,iVar35,scale,pfVar38,pfVar1);
        iVar42 = iimage->width;
        pfVar43 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar40 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar48 = iVar35 + -1 + scale;
        iVar46 = iVar40 * iVar28;
        iVar52 = iVar40 * iVar22;
        fVar68 = pfVar3[iVar52 + -1 + iVar35];
        fVar72 = pfVar3[iVar46 + -1 + iVar39];
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar46 + iVar48] - pfVar3[iVar52 + iVar48]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar52 + -1 + iVar39] -
                                                pfVar3[iVar46 + -1 + iVar35])));
        auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 * iVar29 + -1 + iVar35] -
                                                pfVar3[iVar40 * iVar29 + -1 + iVar39])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar52 + -1 + iVar39] -
                                                pfVar3[iVar46 + -1 + iVar35])));
        *pfVar38 = (fVar68 - fVar72) + auVar55._0_4_;
        *pfVar1 = auVar57._0_4_ - (fVar68 - fVar72);
      }
      pfVar38 = (float *)((long)pfVar43 + lVar32 + 100);
      pfVar1 = (float *)((long)pfVar53 + lVar32 + 100);
      if ((((iVar19 < 1) || (iVar35 < 1)) || (iimage->height < iVar23)) ||
         (iVar39 = iVar2 + iVar35, iVar42 < iVar39)) {
        haarXY(iimage,iVar19,iVar35,scale,pfVar38,pfVar1);
        iVar42 = iimage->width;
        pfVar43 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar40 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar46 = iVar35 + -1 + scale;
        iVar52 = iVar40 * iVar37;
        iVar48 = iVar40 * iVar20;
        fVar68 = pfVar3[iVar48 + -1 + iVar35];
        fVar72 = pfVar3[iVar52 + -1 + iVar39];
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar52 + iVar46] - pfVar3[iVar48 + iVar46]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar48 + -1 + iVar39] -
                                                pfVar3[iVar52 + -1 + iVar35])));
        auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 * iVar30 + -1 + iVar35] -
                                                pfVar3[iVar40 * iVar30 + -1 + iVar39])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar48 + -1 + iVar39] -
                                                pfVar3[iVar52 + -1 + iVar35])));
        *pfVar38 = (fVar68 - fVar72) + auVar55._0_4_;
        *pfVar1 = auVar57._0_4_ - (fVar68 - fVar72);
      }
      auVar55 = vpbroadcastd_avx512vl();
      auVar55 = vpaddd_avx(auVar55,_DAT_00599790);
      pfVar38 = (float *)((long)pfVar43 + lVar32 + 8);
      pfVar1 = (float *)((long)pfVar53 + lVar32 + 8);
      auVar55 = vcvtdq2ps_avx(auVar55);
      auVar17._4_4_ = fVar5;
      auVar17._0_4_ = fVar5;
      auVar17._8_4_ = fVar5;
      auVar17._12_4_ = fVar5;
      auVar18._4_4_ = fVar69;
      auVar18._0_4_ = fVar69;
      auVar18._8_4_ = fVar69;
      auVar18._12_4_ = fVar69;
      auVar57 = vfmadd132ps_fma(auVar55,auVar17,auVar18);
      auVar55 = vshufps_avx(auVar57,auVar57,0xff);
      uVar25 = vcmpps_avx512vl(auVar57,_DAT_00599190,0xd);
      bVar54 = (byte)(uVar25 >> 3);
      iVar35 = (int)((double)((ulong)(bVar54 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar54 & 1) * -0x4020000000000000) +
                    (double)auVar55._0_4_);
      if (((iVar21 < 1) || (iVar35 < 1)) ||
         ((iimage->height < iVar27 || (iVar39 = iVar2 + iVar35, iVar42 < iVar39)))) {
        haarXY(iimage,iVar21,iVar35,scale,pfVar38,pfVar1);
        iVar42 = iimage->width;
        pfVar43 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar40 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar48 = iVar35 + -1 + scale;
        iVar46 = iVar40 * iVar28;
        iVar52 = iVar40 * iVar22;
        fVar68 = pfVar3[iVar52 + -1 + iVar35];
        fVar72 = pfVar3[iVar46 + -1 + iVar39];
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar46 + iVar48] - pfVar3[iVar52 + iVar48]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar52 + -1 + iVar39] -
                                                pfVar3[iVar46 + -1 + iVar35])));
        auVar58 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 * iVar29 + -1 + iVar35] -
                                                pfVar3[iVar40 * iVar29 + -1 + iVar39])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar52 + -1 + iVar39] -
                                                pfVar3[iVar46 + -1 + iVar35])));
        *pfVar38 = (fVar68 - fVar72) + auVar55._0_4_;
        *pfVar1 = auVar58._0_4_ - (fVar68 - fVar72);
      }
      pfVar38 = (float *)((long)pfVar43 + lVar32 + 0x68);
      pfVar1 = (float *)((long)pfVar53 + lVar32 + 0x68);
      if (((iVar19 < 1) || (iVar35 < 1)) ||
         ((iimage->height < iVar23 || (iVar39 = iVar2 + iVar35, iVar42 < iVar39)))) {
        haarXY(iimage,iVar19,iVar35,scale,pfVar38,pfVar1);
        iVar42 = iimage->width;
        pfVar43 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar40 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar46 = iVar35 + -1 + scale;
        iVar52 = iVar40 * iVar37;
        iVar48 = iVar40 * iVar20;
        fVar68 = pfVar3[iVar48 + -1 + iVar35];
        fVar72 = pfVar3[iVar52 + -1 + iVar39];
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar52 + iVar46] - pfVar3[iVar48 + iVar46]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar48 + -1 + iVar39] -
                                                pfVar3[iVar52 + -1 + iVar35])));
        auVar58 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 * iVar30 + -1 + iVar35] -
                                                pfVar3[iVar40 * iVar30 + -1 + iVar39])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar48 + -1 + iVar39] -
                                                pfVar3[iVar52 + -1 + iVar35])));
        *pfVar38 = (fVar68 - fVar72) + auVar55._0_4_;
        *pfVar1 = auVar58._0_4_ - (fVar68 - fVar72);
      }
      auVar55 = vpermilpd_avx(auVar57,1);
      pfVar38 = (float *)((long)pfVar43 + lVar32 + 0xc);
      pfVar1 = (float *)((long)pfVar53 + lVar32 + 0xc);
      bVar54 = (byte)uVar25;
      iVar35 = (int)((double)((ulong)(bVar54 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar54 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar55._0_4_);
      if ((((iVar21 < 1) || (iVar35 < 1)) || (iimage->height < iVar27)) ||
         (iVar39 = iVar2 + iVar35, iVar42 < iVar39)) {
        haarXY(iimage,iVar21,iVar35,scale,pfVar38,pfVar1);
        iVar42 = iimage->width;
        pfVar43 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar40 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar48 = iVar35 + -1 + scale;
        iVar46 = iVar40 * iVar28;
        iVar52 = iVar40 * iVar22;
        fVar68 = pfVar3[iVar52 + -1 + iVar35];
        fVar72 = pfVar3[iVar46 + -1 + iVar39];
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar46 + iVar48] - pfVar3[iVar52 + iVar48]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar52 + -1 + iVar39] -
                                                pfVar3[iVar46 + -1 + iVar35])));
        auVar58 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 * iVar29 + -1 + iVar35] -
                                                pfVar3[iVar40 * iVar29 + -1 + iVar39])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar52 + -1 + iVar39] -
                                                pfVar3[iVar46 + -1 + iVar35])));
        *pfVar38 = (fVar68 - fVar72) + auVar55._0_4_;
        *pfVar1 = auVar58._0_4_ - (fVar68 - fVar72);
      }
      pfVar38 = (float *)((long)pfVar43 + lVar32 + 0x6c);
      pfVar1 = (float *)((long)pfVar53 + lVar32 + 0x6c);
      if (((iVar19 < 1) || (iVar35 < 1)) ||
         ((iimage->height < iVar23 || (iVar39 = iVar2 + iVar35, iVar42 < iVar39)))) {
        haarXY(iimage,iVar19,iVar35,scale,pfVar38,pfVar1);
        iVar42 = iimage->width;
        pfVar43 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar40 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar46 = iVar35 + -1 + scale;
        iVar52 = iVar40 * iVar37;
        iVar48 = iVar40 * iVar20;
        fVar68 = pfVar3[iVar48 + -1 + iVar35];
        fVar72 = pfVar3[iVar52 + -1 + iVar39];
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar52 + iVar46] - pfVar3[iVar48 + iVar46]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar48 + -1 + iVar39] -
                                                pfVar3[iVar52 + -1 + iVar35])));
        auVar58 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 * iVar30 + -1 + iVar35] -
                                                pfVar3[iVar40 * iVar30 + -1 + iVar39])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar48 + -1 + iVar39] -
                                                pfVar3[iVar52 + -1 + iVar35])));
        *pfVar38 = (fVar68 - fVar72) + auVar55._0_4_;
        *pfVar1 = auVar58._0_4_ - (fVar68 - fVar72);
      }
      auVar55 = vmovshdup_avx(auVar57);
      pfVar38 = (float *)((long)pfVar43 + lVar32 + 0x10);
      pfVar1 = (float *)((long)pfVar53 + lVar32 + 0x10);
      iVar35 = (int)((double)((ulong)(bVar54 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar54 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar55._0_4_);
      if (((iVar21 < 1) || (iVar35 < 1)) ||
         ((iimage->height < iVar27 || (iVar39 = iVar2 + iVar35, iVar42 < iVar39)))) {
        haarXY(iimage,iVar21,iVar35,scale,pfVar38,pfVar1);
        iVar42 = iimage->width;
        pfVar43 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar40 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar48 = iVar35 + -1 + scale;
        iVar46 = iVar40 * iVar28;
        iVar52 = iVar40 * iVar22;
        fVar68 = pfVar3[iVar52 + -1 + iVar35];
        fVar72 = pfVar3[iVar46 + -1 + iVar39];
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar46 + iVar48] - pfVar3[iVar52 + iVar48]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar52 + -1 + iVar39] -
                                                pfVar3[iVar46 + -1 + iVar35])));
        auVar58 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 * iVar29 + -1 + iVar35] -
                                                pfVar3[iVar40 * iVar29 + -1 + iVar39])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar52 + -1 + iVar39] -
                                                pfVar3[iVar46 + -1 + iVar35])));
        *pfVar38 = (fVar68 - fVar72) + auVar55._0_4_;
        *pfVar1 = auVar58._0_4_ - (fVar68 - fVar72);
      }
      pfVar38 = (float *)((long)pfVar43 + lVar32 + 0x70);
      pfVar1 = (float *)((long)pfVar53 + lVar32 + 0x70);
      if ((((iVar19 < 1) || (iVar35 < 1)) || (iimage->height < iVar23)) ||
         (iVar39 = iVar2 + iVar35, iVar42 < iVar39)) {
        haarXY(iimage,iVar19,iVar35,scale,pfVar38,pfVar1);
        iVar42 = iimage->width;
        pfVar43 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar40 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar46 = iVar35 + -1 + scale;
        iVar52 = iVar40 * iVar37;
        iVar48 = iVar40 * iVar20;
        fVar68 = pfVar3[iVar48 + -1 + iVar35];
        fVar72 = pfVar3[iVar52 + -1 + iVar39];
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar52 + iVar46] - pfVar3[iVar48 + iVar46]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar48 + -1 + iVar39] -
                                                pfVar3[iVar52 + -1 + iVar35])));
        auVar58 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 * iVar30 + -1 + iVar35] -
                                                pfVar3[iVar40 * iVar30 + -1 + iVar39])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar48 + -1 + iVar39] -
                                                pfVar3[iVar52 + -1 + iVar35])));
        *pfVar38 = (fVar68 - fVar72) + auVar55._0_4_;
        *pfVar1 = auVar58._0_4_ - (fVar68 - fVar72);
      }
      local_d8 = auVar57._0_4_;
      pfVar38 = (float *)((long)pfVar43 + lVar32 + 0x14);
      pfVar1 = (float *)((long)pfVar53 + lVar32 + 0x14);
      iVar35 = (int)((double)((ulong)(bVar54 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar54 & 1) * -0x4020000000000000) + (double)local_d8);
      if (((iVar21 < 1) || (iVar35 < 1)) ||
         ((iimage->height < iVar27 || (iVar39 = iVar2 + iVar35, iVar42 < iVar39)))) {
        haarXY(iimage,iVar21,iVar35,scale,pfVar38,pfVar1);
        iVar42 = iimage->width;
        pfVar43 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar40 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar48 = iVar35 + -1 + scale;
        iVar46 = iVar40 * iVar28;
        iVar52 = iVar40 * iVar22;
        fVar68 = pfVar3[iVar52 + -1 + iVar35];
        fVar72 = pfVar3[iVar46 + -1 + iVar39];
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar46 + iVar48] - pfVar3[iVar52 + iVar48]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar52 + -1 + iVar39] -
                                                pfVar3[iVar46 + -1 + iVar35])));
        auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 * iVar29 + -1 + iVar35] -
                                                pfVar3[iVar40 * iVar29 + -1 + iVar39])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar52 + -1 + iVar39] -
                                                pfVar3[iVar46 + -1 + iVar35])));
        *pfVar38 = (fVar68 - fVar72) + auVar55._0_4_;
        *pfVar1 = auVar57._0_4_ - (fVar68 - fVar72);
      }
      pfVar38 = (float *)((long)pfVar43 + lVar32 + 0x74);
      pfVar1 = (float *)((long)pfVar53 + lVar32 + 0x74);
      if (((iVar19 < 1) || (iVar35 < 1)) ||
         ((iimage->height < iVar23 || (iVar39 = iVar2 + iVar35, iVar42 < iVar39)))) {
        haarXY(iimage,iVar19,iVar35,scale,pfVar38,pfVar1);
        pfVar43 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar42 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar40 = iVar35 + -1 + scale;
        iVar48 = iVar42 * iVar37;
        iVar46 = iVar42 * iVar20;
        fVar68 = pfVar3[iVar46 + -1 + iVar35];
        fVar72 = pfVar3[iVar48 + -1 + iVar39];
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar48 + iVar40] - pfVar3[iVar46 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar39] -
                                                pfVar3[iVar48 + -1 + iVar35])));
        auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar42 * iVar30 + -1 + iVar35] -
                                                pfVar3[iVar42 * iVar30 + -1 + iVar39])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar39] -
                                                pfVar3[iVar48 + -1 + iVar35])));
        *pfVar38 = (fVar68 - fVar72) + auVar55._0_4_;
        *pfVar1 = auVar57._0_4_ - (fVar68 - fVar72);
      }
      auVar93 = ZEXT1664(auVar56);
      lVar32 = lVar32 + 0x18;
      bVar4 = iVar51 < 6;
      iVar51 = iVar51 + 6;
    } while (bVar4);
    lVar33 = lVar33 + 0xc0;
    bVar4 = (int)uVar24 < 10;
    uVar24 = uVar24 + 2;
  } while (bVar4);
LAB_001b9c77:
  fVar92 = auVar93._0_4_;
  auVar91._8_4_ = 0x3effffff;
  auVar91._0_8_ = 0x3effffff3effffff;
  auVar91._12_4_ = 0x3effffff;
  auVar90._8_4_ = 0x80000000;
  auVar90._0_8_ = 0x8000000080000000;
  auVar90._12_4_ = 0x80000000;
  auVar55 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 0.5)),auVar90,0xf8);
  auVar55 = ZEXT416((uint)(fVar92 * 0.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 1.5)),auVar90,0xf8);
  auVar56 = ZEXT416((uint)(fVar92 * 1.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 2.5)),auVar90,0xf8);
  auVar57 = ZEXT416((uint)(fVar92 * 2.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 3.5)),auVar90,0xf8);
  auVar58 = ZEXT416((uint)(fVar92 * 3.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 4.5)),auVar90,0xf8);
  auVar59 = ZEXT416((uint)(fVar92 * 4.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 5.5)),auVar90,0xf8);
  auVar60 = ZEXT416((uint)(fVar92 * 5.5 + auVar60._0_4_));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 6.5)),auVar90,0xf8);
  auVar61 = ZEXT416((uint)(fVar92 * 6.5 + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 7.5)),auVar90,0xf8);
  auVar62 = ZEXT416((uint)(auVar62._0_4_ + fVar92 * 7.5));
  auVar62 = vroundss_avx(auVar62,auVar62,0xb);
  auVar63 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 8.5)),auVar90,0xf8);
  auVar63 = ZEXT416((uint)(fVar92 * 8.5 + auVar63._0_4_));
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  auVar64 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 9.5)),auVar90,0xf8);
  auVar64 = ZEXT416((uint)(fVar92 * 9.5 + auVar64._0_4_));
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  auVar65 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 10.5)),auVar90,0xf8);
  auVar65 = ZEXT416((uint)(fVar92 * 10.5 + auVar65._0_4_));
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  auVar66 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 11.5)),auVar90,0xf8);
  fVar75 = auVar57._0_4_;
  fVar69 = fVar75 + auVar56._0_4_;
  fVar5 = fVar75 + auVar55._0_4_;
  auVar57 = ZEXT416((uint)(fVar92 * 11.5 + auVar66._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  fVar92 = fVar75 - auVar55._0_4_;
  fVar68 = fVar75 - auVar56._0_4_;
  fVar72 = fVar75 - auVar58._0_4_;
  fVar6 = fVar75 - auVar59._0_4_;
  fVar7 = fVar75 - auVar60._0_4_;
  fVar75 = fVar75 - auVar61._0_4_;
  fVar87 = auVar62._0_4_;
  fVar8 = fVar87 - auVar58._0_4_;
  fVar9 = fVar87 - auVar59._0_4_;
  fVar10 = fVar87 - auVar60._0_4_;
  fVar11 = fVar87 - auVar61._0_4_;
  fVar12 = fVar87 - auVar63._0_4_;
  fVar13 = fVar87 - auVar64._0_4_;
  fVar14 = fVar87 - auVar65._0_4_;
  fVar87 = fVar87 - auVar57._0_4_;
  gauss_s1_c0[0] = expf(fVar69 * fVar69 * fVar67);
  gauss_s1_c0[1] = expf(fVar5 * fVar5 * fVar67);
  gauss_s1_c0[2] = expf(fVar92 * fVar92 * fVar67);
  gauss_s1_c0[3] = expf(fVar68 * fVar68 * fVar67);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar72 * fVar72 * fVar67);
  gauss_s1_c0[6] = expf(fVar6 * fVar6 * fVar67);
  gauss_s1_c0[7] = expf(fVar7 * fVar7 * fVar67);
  gauss_s1_c0[8] = expf(fVar75 * fVar75 * fVar67);
  gauss_s1_c1[0] = expf(fVar8 * fVar8 * fVar67);
  gauss_s1_c1[1] = expf(fVar9 * fVar9 * fVar67);
  gauss_s1_c1[2] = expf(fVar10 * fVar10 * fVar67);
  gauss_s1_c1[3] = expf(fVar11 * fVar11 * fVar67);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar12 * fVar12 * fVar67);
  gauss_s1_c1[6] = expf(fVar13 * fVar13 * fVar67);
  gauss_s1_c1[7] = expf(fVar14 * fVar14 * fVar67);
  gauss_s1_c1[8] = expf(fVar87 * fVar87 * fVar67);
  auVar74._8_4_ = 0x7fffffff;
  auVar74._0_8_ = 0x7fffffff7fffffff;
  auVar74._12_4_ = 0x7fffffff;
  uVar25 = 0xfffffff8;
  fVar69 = 0.0;
  lVar33 = 0;
  lVar32 = 0;
  local_d8 = 0.0;
  do {
    pfVar43 = gauss_s1_c1;
    uVar24 = (uint)uVar25;
    if (uVar24 != 7) {
      pfVar43 = gauss_s1_c0;
    }
    lVar49 = (long)(int)local_d8;
    lVar32 = (long)(int)lVar32;
    if (uVar24 == 0xfffffff8) {
      pfVar43 = gauss_s1_c1;
    }
    uVar47 = 0;
    local_d8 = (float)((int)local_d8 + 4);
    uVar41 = 0xfffffff8;
    lVar44 = (long)haarResponseX + lVar33;
    lVar34 = (long)haarResponseY + lVar33;
    do {
      pfVar53 = gauss_s1_c1;
      if (uVar41 != 7) {
        pfVar53 = gauss_s1_c0;
      }
      auVar88 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar41 == 0xfffffff8) {
        pfVar53 = gauss_s1_c1;
      }
      uVar26 = (ulong)(uVar41 >> 0x1c & 0xfffffff8);
      uVar31 = uVar47;
      lVar36 = lVar34;
      lVar50 = lVar44;
      do {
        lVar45 = 0;
        pfVar38 = (float *)((long)pfVar43 + (ulong)(uint)((int)(uVar25 >> 0x1f) << 5));
        do {
          fVar5 = pfVar53[uVar26] * *pfVar38;
          pfVar38 = pfVar38 + (ulong)(~uVar24 >> 0x1f) * 2 + -1;
          auVar55 = vinsertps_avx(ZEXT416(*(uint *)(lVar36 + lVar45 * 4)),
                                  ZEXT416(*(uint *)(lVar50 + lVar45 * 4)),0x10);
          lVar45 = lVar45 + 1;
          auVar83._0_4_ = fVar5 * auVar55._0_4_;
          auVar83._4_4_ = fVar5 * auVar55._4_4_;
          auVar83._8_4_ = fVar5 * auVar55._8_4_;
          auVar83._12_4_ = fVar5 * auVar55._12_4_;
          auVar55 = vandps_avx(auVar83,auVar74);
          auVar55 = vmovlhps_avx(auVar83,auVar55);
          auVar77._0_4_ = auVar88._0_4_ + auVar55._0_4_;
          auVar77._4_4_ = auVar88._4_4_ + auVar55._4_4_;
          auVar77._8_4_ = auVar88._8_4_ + auVar55._8_4_;
          auVar77._12_4_ = auVar88._12_4_ + auVar55._12_4_;
          auVar88 = ZEXT1664(auVar77);
        } while (lVar45 != 9);
        uVar31 = uVar31 + 0x18;
        uVar26 = uVar26 + (ulong)(-1 < (int)uVar41) * 2 + -1;
        lVar50 = lVar50 + 0x60;
        lVar36 = lVar36 + 0x60;
      } while (uVar31 < uVar41 * 0x18 + 0x198);
      uVar41 = uVar41 + 5;
      uVar47 = uVar47 + 0x78;
      fVar5 = gauss_s2_arr[lVar49];
      auVar16._4_4_ = fVar5;
      auVar16._0_4_ = fVar5;
      auVar16._8_4_ = fVar5;
      auVar16._12_4_ = fVar5;
      auVar58 = vmulps_avx512vl(auVar77,auVar16);
      lVar49 = lVar49 + 1;
      auVar78._0_4_ = auVar58._0_4_ * auVar58._0_4_;
      auVar78._4_4_ = auVar58._4_4_ * auVar58._4_4_;
      auVar78._8_4_ = auVar58._8_4_ * auVar58._8_4_;
      auVar78._12_4_ = auVar58._12_4_ * auVar58._12_4_;
      auVar56 = vshufpd_avx(auVar58,auVar58,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar32) = auVar58;
      lVar32 = lVar32 + 4;
      lVar44 = lVar44 + 0x1e0;
      lVar34 = lVar34 + 0x1e0;
      auVar55 = vmovshdup_avx(auVar78);
      auVar57 = vfmadd231ss_fma(auVar55,auVar58,auVar58);
      auVar55 = vshufps_avx(auVar58,auVar58,0xff);
      auVar56 = vfmadd213ss_fma(auVar56,auVar56,auVar57);
      auVar55 = vfmadd213ss_fma(auVar55,auVar55,auVar56);
      fVar69 = fVar69 + auVar55._0_4_;
    } while (local_d8 != (float)(int)lVar49);
    lVar33 = lVar33 + 0x14;
    uVar25 = (ulong)(uVar24 + 5);
  } while ((int)uVar24 < 3);
  if (fVar69 < 0.0) {
    fVar69 = sqrtf(fVar69);
  }
  else {
    auVar55 = vsqrtss_avx(ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
    fVar69 = auVar55._0_4_;
  }
  lVar33 = 0;
  auVar88 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar69)));
  do {
    auVar93 = vmulps_avx512f(auVar88,*(undefined1 (*) [64])(ipoint->descriptor + lVar33));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar33) = auVar93;
    lVar33 = lVar33 + 0x10;
  } while (lVar33 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_6_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}